

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldh_join_ti_impl.h
# Opt level: O0

void __thiscall
join::
LDHJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::verify_candidates(LDHJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
                    *this,vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                          *trees_collection,
                   vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *candidates,
                   vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>
                   *join_result,double distance_threshold)

{
  bool bVar1;
  reference pvVar2;
  longlong lVar3;
  double local_1f0;
  double ted_value;
  pair<int,_int> *pair;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range2;
  AlgsTreeIndex ti_2;
  AlgsTreeIndex ti_1;
  TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
  ted_algorithm;
  UnitCostModelLD<label::StringLabel> local_90;
  AlgsCostModel cm;
  LabelDictionary<label::StringLabel> ld;
  double distance_threshold_local;
  vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *join_result_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *candidates_local;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  *trees_collection_local;
  LDHJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
  *this_local;
  
  label::LabelDictionary<label::StringLabel>::LabelDictionary
            ((LabelDictionary<label::StringLabel> *)&cm);
  cost_model::UnitCostModelLD<label::StringLabel>::UnitCostModelLD
            (&local_90,(LabelDictionary<label::StringLabel> *)&cm);
  ted::
  TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
  ::TEDAlgorithm((TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
                  *)&ti_1.super_PostLToDepth.postl_to_depth_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_end_of_storage,&local_90);
  node::TreeIndexTouzetBaseline::TreeIndexTouzetBaseline
            ((TreeIndexTouzetBaseline *)
             &ti_2.super_PostLToDepth.postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  node::TreeIndexTouzetBaseline::TreeIndexTouzetBaseline((TreeIndexTouzetBaseline *)&__range2);
  __end2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                     (candidates);
  pair = (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(candidates);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)&pair);
    if (!bVar1) break;
    ted_value = (double)__gnu_cxx::
                        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        ::operator*(&__end2);
    pvVar2 = std::
             vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
             ::operator[](trees_collection,(long)((reference)ted_value)->first);
    node::
    index_tree<node::TreeIndexTouzetBaseline,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
              ((TreeIndexTouzetBaseline *)
               &ti_2.super_PostLToDepth.postl_to_depth_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,pvVar2,(LabelDictionary<label::StringLabel> *)&cm,&local_90);
    pvVar2 = std::
             vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
             ::operator[](trees_collection,(long)*(int *)((long)ted_value + 4));
    node::
    index_tree<node::TreeIndexTouzetBaseline,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
              ((TreeIndexTouzetBaseline *)&__range2,pvVar2,
               (LabelDictionary<label::StringLabel> *)&cm,&local_90);
    local_1f0 = ted::
                TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
                ::ted_k((TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
                         *)&ti_1.super_PostLToDepth.postl_to_depth_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                        (TreeIndexTouzetBaseline *)
                        &ti_2.super_PostLToDepth.postl_to_depth_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                        (TreeIndexTouzetBaseline *)&__range2,(int)distance_threshold);
    if (local_1f0 <= distance_threshold) {
      std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>::
      emplace_back<int_const&,int_const&,double&>
                ((vector<join::JoinResultElement,std::allocator<join::JoinResultElement>> *)
                 join_result,(int *)ted_value,(int *)((long)ted_value + 4),&local_1f0);
    }
    lVar3 = ted::
            TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
            ::get_subproblem_count
                      ((TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
                        *)&ti_1.super_PostLToDepth.postl_to_depth_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    this->sum_subproblem_counter_ = lVar3 + this->sum_subproblem_counter_;
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end2);
  }
  node::TreeIndexTouzetBaseline::~TreeIndexTouzetBaseline((TreeIndexTouzetBaseline *)&__range2);
  node::TreeIndexTouzetBaseline::~TreeIndexTouzetBaseline
            ((TreeIndexTouzetBaseline *)
             &ti_2.super_PostLToDepth.postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ted::
  TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
  ::~TouzetBaselineTreeIndex
            ((TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
              *)&ti_1.super_PostLToDepth.postl_to_depth_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage);
  label::LabelDictionary<label::StringLabel>::~LabelDictionary
            ((LabelDictionary<label::StringLabel> *)&cm);
  return;
}

Assistant:

void LDHJoinTI<Label, VerificationAlgorithm>::verify_candidates(
    std::vector<node::Node<Label>>& trees_collection,
    std::vector<std::pair<int, int>>& candidates,
    std::vector<join::JoinResultElement>& join_result,
    const double distance_threshold) {

  label::LabelDictionary<Label> ld;
  typename VerificationAlgorithm::AlgsCostModel cm(ld);
  VerificationAlgorithm ted_algorithm(cm);
  typename VerificationAlgorithm::AlgsTreeIndex ti_1;
  typename VerificationAlgorithm::AlgsTreeIndex ti_2;

  // Verify each pair in the candidate set
  for(const auto& pair: candidates) {
    node::index_tree(ti_1, trees_collection[pair.first], ld, cm);
    node::index_tree(ti_2, trees_collection[pair.second], ld, cm);
    double ted_value = ted_algorithm.ted_k(ti_1, ti_2, distance_threshold);
    if(ted_value <= distance_threshold)
      join_result.emplace_back(pair.first, pair.second, ted_value);
    // Sum up all number of subproblems
    sum_subproblem_counter_ += ted_algorithm.get_subproblem_count();
  }
}